

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase.h
# Opt level: O2

PointType __thiscall jhu::thrax::PhrasalRule::terminalIndex<false>(PhrasalRule *this,PointType i)

{
  Span SVar1;
  int iVar2;
  PointType PVar3;
  int iVar4;
  long lVar5;
  undefined2 in_register_00000032;
  int iVar6;
  
  iVar6 = CONCAT22(in_register_00000032,i);
  SVar1 = (this->lhs).span.tgt;
  PVar3 = -1;
  if ((iVar6 < (int)SVar1 >> 0x10) && (SVar1.start <= iVar6)) {
    iVar4 = iVar6 - (int)SVar1;
    for (lVar5 = 4; lVar5 != 100; lVar5 = lVar5 + 0x18) {
      iVar2 = *(int *)((long)&(this->nts)._M_elems[0].span.src.start + lVar5);
      if ((short)iVar2 <= iVar6) {
        if (iVar6 < iVar2 >> 0x10) {
          return -1;
        }
        iVar4 = iVar4 + (iVar2 - (iVar2 >> 0x10));
      }
    }
    PVar3 = (PointType)iVar4;
  }
  return PVar3;
}

Assistant:

Span get() const {
    if constexpr (SourceSide) {
      return src;
    } else {
      return tgt;
    }
  }